

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall CConsole::ParseArgs(CConsole *this,CResult *pResult,char *pFormat)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char *in_RDX;
  CResult *in_RSI;
  CConsole *in_RDI;
  long in_FS_OFFSET;
  char *pDst;
  int Error;
  int Optional;
  char *pStr;
  char Command;
  char **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *local_40;
  uint local_38;
  char *local_30;
  uint local_18;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = *in_RDX;
  bVar3 = false;
  local_38 = 0;
  local_30 = in_RSI->m_pArgsStart;
  do {
    if ((local_38 != 0) || (cVar1 == '\0')) goto LAB_0022a981;
    if (cVar1 == '?') {
      bVar3 = true;
    }
    else {
      local_30 = str_skip_whitespaces(local_30);
      if (*local_30 == '\0') {
        if (!bVar3) {
          local_38 = 1;
        }
LAB_0022a981:
        local_18 = local_38;
LAB_0022a989:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
          __stack_chk_fail();
        }
        return local_18;
      }
      if (*local_30 == '\"') {
        local_40 = local_30 + 1;
        CResult::AddArgument(in_RSI,local_40);
        for (local_30 = local_40; *local_30 != '\"'; local_30 = local_30 + 1) {
          if (*local_30 == '\\') {
            if (local_30[1] == '\\') {
              local_30 = local_30 + 1;
            }
            else if (local_30[1] == '\"') {
              local_30 = local_30 + 1;
            }
          }
          else if (*local_30 == '\0') {
            local_18 = 1;
            goto LAB_0022a989;
          }
          *local_40 = *local_30;
          local_40 = local_40 + 1;
        }
        *local_40 = '\0';
        local_30 = local_30 + 1;
      }
      else {
        CResult::AddArgument(in_RSI,local_30);
        if (cVar1 == 'r') {
          str_utf8_trim_whitespaces_right
                    ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          goto LAB_0022a981;
        }
        if (cVar1 == 'i') {
          local_30 = str_skip_to_whitespace(local_30);
        }
        else if (cVar1 == 'f') {
          local_30 = str_skip_to_whitespace(local_30);
        }
        else if (cVar1 == 's') {
          local_30 = str_skip_to_whitespace(local_30);
        }
        if (*local_30 != '\0') {
          *local_30 = '\0';
          local_30 = local_30 + 1;
        }
      }
    }
    bVar4 = NextParam(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
    local_38 = (uint)bVar4;
  } while( true );
}

Assistant:

int CConsole::ParseArgs(CResult *pResult, const char *pFormat)
{
	char Command = *pFormat;
	char *pStr;
	int Optional = 0;
	int Error = 0;

	pStr = pResult->m_pArgsStart;

	while(!Error)
	{
		if(!Command)
			break;

		if(Command == '?')
			Optional = 1;
		else
		{
			pStr = str_skip_whitespaces(pStr);

			if(!(*pStr)) // error, non optional command needs value
			{
				if(!Optional)
				{
					Error = 1;
				}
				break;
			}

			// add token
			if(*pStr == '"')
			{
				char *pDst;
				pStr++;
				pResult->AddArgument(pStr);

				pDst = pStr; // we might have to process escape data
				while(1)
				{
					if(pStr[0] == '"')
						break;
					else if(pStr[0] == '\\')
					{
						if(pStr[1] == '\\')
							pStr++; // skip due to escape
						else if(pStr[1] == '"')
							pStr++; // skip due to escape
					}
					else if(pStr[0] == 0)
						return 1; // return error

					*pDst = *pStr;
					pDst++;
					pStr++;
				}

				// write null termination
				*pDst = 0;


				pStr++;
			}
			else
			{
				pResult->AddArgument(pStr);

				if(Command == 'r') // rest of the string
				{
					str_utf8_trim_whitespaces_right(pStr);
					break;
				}
				else if(Command == 'i') // validate int
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 'f') // validate float
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 's') // validate string
					pStr = str_skip_to_whitespace(pStr);

				if(pStr[0] != 0) // check for end of string
				{
					pStr[0] = 0;
					pStr++;
				}
			}
		}

		// fetch next command
		Error = NextParam(&Command, pFormat);
	}

	return Error;
}